

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# networkDataTypes.cpp
# Opt level: O0

bool __thiscall NDeviceChannel::isValid(NDeviceChannel *this)

{
  ulong uVar1;
  long in_RDI;
  undefined1 local_1;
  
  uVar1 = std::__cxx11::string::empty();
  if (((((uVar1 & 1) == 0) && (*(int *)(in_RDI + 0x28) != -1)) && (*(int *)(in_RDI + 0x30) != -1))
     && (*(int *)(in_RDI + 0x2c) != -1)) {
    local_1 = true;
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool NDeviceChannel::isValid() const {
    if (id.empty() || startByte == -1 || type == -1 || startBit == -1)
        return(false); //a device must have an id, a startByte and a type to be valid
    return(true);
}